

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O2

const_iterator __thiscall
frozen::set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_>::find<char[2]>
          (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *this,
          char (*key) [2])

{
  bool bVar1;
  const_iterator other;
  basic_string<char> local_28;
  
  other = lower_bound<char[2]>(this,key);
  if (other != (const_iterator)(this + 1)) {
    local_28.size_ = 1;
    local_28.data_ = *key;
    bVar1 = basic_string<char>::operator<(&local_28,other);
    if (!bVar1) {
      return other;
    }
  }
  return (const_iterator)(this + 1);
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }